

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
Parfait::UgridReader::readPyramids
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *filename,int begin,
          int end,bool swapBytes)

{
  int iVar1;
  bool bVar2;
  char *__filename;
  domain_error *this;
  reference pvVar3;
  reference piVar4;
  int local_e4;
  int i_1;
  int *vertex;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  size_t i;
  unsigned_long byteOffset;
  string local_a8 [32];
  FILE *local_88;
  FILE *f;
  value_type_conflict1 local_78;
  undefined1 local_71;
  int local_70;
  int nrequested;
  string local_60 [32];
  int local_40;
  int local_3c;
  int nhex;
  int nprism;
  int npyr;
  int ntet;
  int nquad;
  int ntri;
  int nnodes;
  int iStack_1c;
  bool swapBytes_local;
  int end_local;
  int begin_local;
  string *filename_local;
  vector<int,_std::allocator<int>_> *pyrs;
  
  ntri._3_1_ = swapBytes;
  nnodes = end;
  iStack_1c = begin;
  _end_local = filename;
  filename_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string(local_60,(string *)filename);
  readHeader((string *)local_60,&nquad,&ntet,&npyr,&nprism,&nhex,&local_3c,&local_40,
             (bool)(ntri._3_1_ & 1));
  std::__cxx11::string::~string(local_60);
  local_70 = nnodes - iStack_1c;
  local_71 = 0;
  iVar1 = local_70 * 5;
  local_78 = 0;
  std::allocator<int>::allocator((allocator<int> *)((long)&f + 7));
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)iVar1,&local_78,(allocator<int> *)((long)&f + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&f + 7));
  __filename = (char *)std::__cxx11::string::c_str();
  local_88 = fopen(__filename,"rb");
  if (local_88 == (FILE *)0x0) {
    this = (domain_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Could not open .ugrid file: ");
    std::domain_error::domain_error(this,local_a8);
    __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  fseek(local_88,(long)(nquad * 3) * 8 + 0x1c + (long)(ntet * 3) * 4 + (long)(npyr << 2) * 4 +
                 (long)(ntet + npyr) * 4 + (long)(nprism << 2) * 4 + (long)(iStack_1c * 5) * 4,0);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
  fread(pvVar3,4,(long)(local_70 * 5),local_88);
  fclose(local_88);
  if ((ntri._3_1_ & 1) != 0) {
    for (__range1 = (vector<int,_std::allocator<int>_> *)0x0;
        __range1 < (vector<int,_std::allocator<int>_> *)(long)(local_70 * 5);
        __range1 = (vector<int,_std::allocator<int>_> *)
                   ((long)&(__range1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1)) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (__return_storage_ptr__,(size_type)__range1);
      bswap_32(pvVar3);
    }
  }
  __end1 = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  vertex = (int *)std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&vertex), bVar2) {
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    *piVar4 = *piVar4 + -1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  for (local_e4 = 0; local_e4 < local_70; local_e4 = local_e4 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)(local_e4 * 5));
    AflrToCGNS::convertPyramid<int>(pvVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<int> Parfait::UgridReader::readPyramids(std::string filename,int begin,int end,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    // get header info and allocate space for triangles
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);
    int nrequested = end - begin;
    std::vector<int> pyrs(5*nrequested,0);

    FILE *f = fopen(filename.c_str(),"rb");
    if(f == NULL){
        throw std::domain_error("Could not open .ugrid file: "+filename);
    }
    unsigned long int byteOffset = 7*sizeof(int) + 3*nnodes*sizeof(double);
    byteOffset += 3*ntri*sizeof(int);
    byteOffset += 4*nquad*sizeof(int);
    byteOffset += (ntri+nquad)*sizeof(int);
    byteOffset += 4*ntet*sizeof(int);
    byteOffset += 5*begin*sizeof(int);
    fseek(f,byteOffset,SEEK_SET);
    fread(&pyrs[0],sizeof(int),5*nrequested,f);
    fclose(f);
    if(swapBytes) {
        for (size_t i = 0; i < 5 * nrequested; i++) {
            bswap_32(&pyrs[i]);
        }
    }

    for(int& vertex : pyrs)
        vertex--;

    for(int i = 0; i < nrequested; i++)
        Parfait::AflrToCGNS::convertPyramid(&pyrs[5*i]);

    return pyrs;
}